

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BasicCopyTexImage2DCase::createTexture(BasicCopyTexImage2DCase *this)

{
  ChannelOrder CVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  Context *pCVar9;
  NotSupportedError *this_00;
  uint uVar10;
  int height;
  uint uVar11;
  ContextWrapper *this_01;
  int width;
  int local_1c4;
  deUint32 tex;
  uint local_1bc;
  BasicCopyTexImage2DCase *local_1b8;
  Random rnd;
  undefined1 *local_1a0;
  float local_198;
  Vec3 local_194;
  GradientShader shader;
  long lVar8;
  
  iVar3 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  local_1bc = 0;
  if ((0 < *(int *)(lVar8 + 8)) && (0 < *(int *)(lVar8 + 0xc))) {
    local_1bc = (uint)(0 < *(int *)(lVar8 + 0x10));
  }
  CVar1 = (this->super_TextureSpecCase).m_texFormat.order;
  local_1c4 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar2 = (this->super_TextureSpecCase).m_width;
    uVar10 = 0x20;
    uVar11 = 0x20;
    if (uVar2 != 0) {
      uVar11 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = uVar11 ^ 0x1f;
    }
    uVar2 = (this->super_TextureSpecCase).m_height;
    if (uVar2 != 0) {
      uVar10 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x1f;
    }
    local_1c4 = 0x1f - uVar10;
    if ((int)(0x1f - uVar10) < (int)(0x1f - uVar11)) {
      local_1c4 = 0x1f - uVar11;
    }
    local_1c4 = local_1c4 + 1;
  }
  iVar3 = *(int *)(lVar8 + 0x14);
  tex = 0;
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  GradientShader::GradientShader(&shader);
  this_01 = &(this->super_TextureSpecCase).super_ContextWrapper;
  local_1b8 = this;
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_01);
  dVar4 = (*pCVar9->_vptr_Context[0x75])(pCVar9);
  if ((CVar1 == A || (local_1bc & 1) != 0) &&
     ((RGBA < CVar1 || (0xedU >> ((byte)CVar1 & 0x1f) & 1) != 0) || 0 < iVar3)) {
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_01);
    local_194.m_data[0] = -1.0;
    local_194.m_data[1] = -1.0;
    local_194.m_data[2] = 0.0;
    local_1a0 = &DAT_3f8000003f800000;
    local_198 = 0.0;
    sglr::drawQuad(pCVar9,dVar4,&local_194,(Vec3 *)&local_1a0);
    sglr::ContextWrapper::glGenTextures(this_01,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_01,0xde1,tex);
    if (0 < local_1c4) {
      iVar3 = 0;
      do {
        width = (local_1b8->super_TextureSpecCase).m_width >> ((byte)iVar3 & 0x1f);
        if (width < 2) {
          width = 1;
        }
        height = (local_1b8->super_TextureSpecCase).m_height >> ((byte)iVar3 & 0x1f);
        if (height < 2) {
          height = 1;
        }
        iVar5 = sglr::ContextWrapper::getWidth(this_01);
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        iVar6 = sglr::ContextWrapper::getHeight(this_01);
        dVar7 = deRandom_getUint32(&rnd.m_rnd);
        sglr::ContextWrapper::glCopyTexImage2D
                  (this_01,0xde1,iVar3,local_1b8->m_internalFormat,dVar4 % ((iVar5 - width) + 1U),
                   dVar7 % ((iVar6 - height) + 1U),width,height,0);
        iVar3 = iVar3 + 1;
      } while (local_1c4 != iVar3);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x509);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		x			= rnd.getInt(0, getWidth()	- levelW);
			int		y			= rnd.getInt(0, getHeight()	- levelH);

			glCopyTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, x, y, levelW, levelH, 0);
		}
	}